

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_rowcol_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int16_t iVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  int iVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar39;
  short sVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  uint uVar49;
  ulong uVar50;
  uint uVar51;
  int iVar52;
  ulong uVar53;
  ulong uVar54;
  int16_t iVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  uint local_3d8;
  uint local_3d0;
  uint local_3c8;
  uint local_3c0;
  uint local_3b0;
  uint local_3a8;
  uint local_3a0;
  uint local_398;
  uint local_390;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  short local_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short sStack_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short sStack_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined2 local_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined1 local_100 [32];
  undefined2 local_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 local_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  ulong uVar38;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_rowcol_diag_avx2_256_16_cold_7();
  }
  else {
    uVar50 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_rowcol_diag_avx2_256_16_cold_6();
    }
    else if (open < 0) {
      parasail_sw_rowcol_diag_avx2_256_16_cold_5();
    }
    else if (gap < 0) {
      parasail_sw_rowcol_diag_avx2_256_16_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_rowcol_diag_avx2_256_16_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_rowcol_diag_avx2_256_16_cold_2();
          return (parasail_result_t *)0x0;
        }
        uVar53 = (ulong)(uint)_s1Len;
        if (_s1Len < 1) {
          parasail_sw_rowcol_diag_avx2_256_16_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar53 = (ulong)(uint)matrix->length;
      }
      iVar20 = matrix->min;
      iVar52 = -iVar20;
      if (iVar20 != -open && SBORROW4(iVar20,-open) == iVar20 + open < 0) {
        iVar52 = open;
      }
      uVar41 = iVar52 - 0x7fff;
      sVar40 = 0x7ffe - (short)matrix->max;
      iVar55 = (int16_t)uVar41;
      local_160._2_2_ = iVar55;
      local_160._0_2_ = iVar55;
      local_160._4_2_ = iVar55;
      local_160._6_2_ = iVar55;
      local_160._8_2_ = iVar55;
      local_160._10_2_ = iVar55;
      local_160._12_2_ = iVar55;
      local_160._14_2_ = iVar55;
      local_160._16_2_ = iVar55;
      local_160._18_2_ = iVar55;
      local_160._20_2_ = iVar55;
      local_160._22_2_ = iVar55;
      local_160._24_2_ = iVar55;
      local_160._26_2_ = iVar55;
      local_160._28_2_ = iVar55;
      local_160._30_2_ = iVar55;
      local_1e0._2_2_ = iVar55;
      local_1e0._0_2_ = iVar55;
      local_1e0._4_2_ = iVar55;
      local_1e0._6_2_ = iVar55;
      local_1e0._8_2_ = iVar55;
      local_1e0._10_2_ = iVar55;
      local_1e0._12_2_ = iVar55;
      local_1e0._14_2_ = iVar55;
      local_1e0._16_2_ = iVar55;
      local_1e0._18_2_ = iVar55;
      local_1e0._20_2_ = iVar55;
      local_1e0._22_2_ = iVar55;
      local_1e0._24_2_ = iVar55;
      local_1e0._26_2_ = iVar55;
      local_1e0._28_2_ = iVar55;
      local_1e0._30_2_ = iVar55;
      local_200._2_2_ = iVar55;
      local_200._0_2_ = iVar55;
      local_200._4_2_ = iVar55;
      local_200._6_2_ = iVar55;
      local_200._8_2_ = iVar55;
      local_200._10_2_ = iVar55;
      local_200._12_2_ = iVar55;
      local_200._14_2_ = iVar55;
      local_200._16_2_ = iVar55;
      local_200._18_2_ = iVar55;
      local_200._20_2_ = iVar55;
      local_200._22_2_ = iVar55;
      local_200._24_2_ = iVar55;
      local_200._26_2_ = iVar55;
      local_200._28_2_ = iVar55;
      local_200._30_2_ = iVar55;
      uVar36 = (uint)uVar53;
      ppVar21 = parasail_result_new_rowcol1(uVar36,s2Len);
      if (ppVar21 != (parasail_result_t *)0x0) {
        ppVar21->flag = ppVar21->flag | 0x10241004;
        uVar37 = (ulong)(s2Len + 0x1e);
        ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar37);
        ptr_00 = parasail_memalign_int16_t(0x20,uVar37);
        ptr_01 = parasail_memalign_int16_t(0x20,uVar37);
        if (ptr_01 != (int16_t *)0x0 &&
            (ptr_00 != (int16_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
          if (matrix->type == 0) {
            iVar20 = uVar36 + 0xf;
            ptr_02 = parasail_memalign_int16_t(0x20,(long)iVar20);
            if (ptr_02 == (int16_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < (int)uVar36) {
              piVar3 = matrix->mapper;
              uVar37 = 0;
              do {
                ptr_02[uVar37] = (int16_t)piVar3[(byte)_s1[uVar37]];
                uVar37 = uVar37 + 1;
              } while (uVar53 != uVar37);
            }
            iVar52 = uVar36 + 1;
            if ((int)(uVar36 + 1) < iVar20) {
              iVar52 = iVar20;
            }
            memset(ptr_02 + (int)uVar36,0,(ulong)(~uVar36 + iVar52) * 2 + 2);
          }
          else {
            ptr_02 = (int16_t *)0x0;
          }
          uVar51 = s2Len + 0xf;
          auVar65._2_2_ = iVar55;
          auVar65._0_2_ = iVar55;
          auVar65._4_2_ = iVar55;
          auVar65._6_2_ = iVar55;
          auVar65._8_2_ = iVar55;
          auVar65._10_2_ = iVar55;
          auVar65._12_2_ = iVar55;
          auVar65._14_2_ = iVar55;
          auVar12._16_2_ = iVar55;
          auVar12._0_16_ = auVar65;
          auVar12._18_2_ = iVar55;
          auVar12._20_2_ = iVar55;
          auVar12._22_2_ = iVar55;
          auVar12._24_2_ = iVar55;
          auVar12._26_2_ = iVar55;
          auVar12._28_2_ = iVar55;
          auVar12._30_2_ = iVar55;
          auVar56 = vpslldq_avx2(ZEXT1632(auVar65),0xe);
          local_100 = vpblendw_avx2(auVar12,auVar56,0x80);
          local_80 = (undefined2)open;
          local_a0 = (undefined2)gap;
          local_120 = (undefined2)uVar53;
          local_c0 = (undefined2)s2Len;
          piVar3 = matrix->mapper;
          uVar37 = 0;
          do {
            *(short *)(ptr[1] + uVar37 * 2 + 0xe) = (short)piVar3[(byte)_s2[uVar37]];
            uVar37 = uVar37 + 1;
          } while (uVar50 != uVar37);
          *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
          *ptr = (undefined1  [16])0x0;
          uVar35 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar51) {
            uVar35 = uVar51;
          }
          uVar37 = 0;
          local_1c0 = sVar40;
          sStack_1be = sVar40;
          sStack_1bc = sVar40;
          sStack_1ba = sVar40;
          sStack_1b8 = sVar40;
          sStack_1b6 = sVar40;
          sStack_1b4 = sVar40;
          sStack_1b2 = sVar40;
          sStack_1b0 = sVar40;
          sStack_1ae = sVar40;
          sStack_1ac = sVar40;
          sStack_1aa = sVar40;
          sStack_1a8 = sVar40;
          sStack_1a6 = sVar40;
          sStack_1a4 = sVar40;
          sStack_1a2 = sVar40;
          uStack_11e = local_120;
          uStack_11c = local_120;
          uStack_11a = local_120;
          uStack_118 = local_120;
          uStack_116 = local_120;
          uStack_114 = local_120;
          uStack_112 = local_120;
          uStack_110 = local_120;
          uStack_10e = local_120;
          uStack_10c = local_120;
          uStack_10a = local_120;
          uStack_108 = local_120;
          uStack_106 = local_120;
          uStack_104 = local_120;
          uStack_102 = local_120;
          uStack_be = local_c0;
          uStack_bc = local_c0;
          uStack_ba = local_c0;
          uStack_b8 = local_c0;
          uStack_b6 = local_c0;
          uStack_b4 = local_c0;
          uStack_b2 = local_c0;
          uStack_b0 = local_c0;
          uStack_ae = local_c0;
          uStack_ac = local_c0;
          uStack_aa = local_c0;
          uStack_a8 = local_c0;
          uStack_a6 = local_c0;
          uStack_a4 = local_c0;
          uStack_a2 = local_c0;
          uStack_9e = local_a0;
          uStack_9c = local_a0;
          uStack_9a = local_a0;
          uStack_98 = local_a0;
          uStack_96 = local_a0;
          uStack_94 = local_a0;
          uStack_92 = local_a0;
          uStack_90 = local_a0;
          uStack_8e = local_a0;
          uStack_8c = local_a0;
          uStack_8a = local_a0;
          uStack_88 = local_a0;
          uStack_86 = local_a0;
          uStack_84 = local_a0;
          uStack_82 = local_a0;
          uStack_7e = local_80;
          uStack_7c = local_80;
          uStack_7a = local_80;
          uStack_78 = local_80;
          uStack_76 = local_80;
          uStack_74 = local_80;
          uStack_72 = local_80;
          uStack_70 = local_80;
          uStack_6e = local_80;
          uStack_6c = local_80;
          uStack_6a = local_80;
          uStack_68 = local_80;
          uStack_66 = local_80;
          uStack_64 = local_80;
          uStack_62 = local_80;
          memset(ptr[1] + uVar50 * 2 + 0xe,0,(ulong)(~s2Len + uVar35) * 2 + 2);
          do {
            ptr_00[uVar37 + 0xf] = 0;
            ptr_01[uVar37 + 0xf] = iVar55;
            uVar37 = uVar37 + 1;
          } while (uVar50 != uVar37);
          lVar22 = 0;
          do {
            ptr_00[lVar22] = iVar55;
            ptr_01[lVar22] = iVar55;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0xf);
          lVar22 = uVar50 + 0xf;
          uVar37 = uVar50;
          do {
            ptr_00[lVar22] = iVar55;
            ptr_01[lVar22] = iVar55;
            lVar22 = lVar22 + 1;
            uVar35 = (int)uVar37 + 1;
            uVar37 = (ulong)uVar35;
          } while ((int)uVar35 < (int)uVar51);
          if ((int)uVar36 < 1) {
            auVar56._2_2_ = iVar55;
            auVar56._0_2_ = iVar55;
            auVar56._4_2_ = iVar55;
            auVar56._6_2_ = iVar55;
            auVar56._8_2_ = iVar55;
            auVar56._10_2_ = iVar55;
            auVar56._12_2_ = iVar55;
            auVar56._14_2_ = iVar55;
            auVar56._16_2_ = iVar55;
            auVar56._18_2_ = iVar55;
            auVar56._20_2_ = iVar55;
            auVar56._22_2_ = iVar55;
            auVar56._24_2_ = iVar55;
            auVar56._26_2_ = iVar55;
            auVar56._28_2_ = iVar55;
            auVar56._30_2_ = iVar55;
            auVar58._2_2_ = sStack_1be;
            auVar58._0_2_ = local_1c0;
            auVar58._4_2_ = sStack_1bc;
            auVar58._6_2_ = sStack_1ba;
            auVar58._8_2_ = sStack_1b8;
            auVar58._10_2_ = sStack_1b6;
            auVar58._12_2_ = sStack_1b4;
            auVar58._14_2_ = sStack_1b2;
            auVar58._16_2_ = sStack_1b0;
            auVar58._18_2_ = sStack_1ae;
            auVar58._20_2_ = sStack_1ac;
            auVar58._22_2_ = sStack_1aa;
            auVar58._24_2_ = sStack_1a8;
            auVar58._26_2_ = sStack_1a6;
            auVar58._28_2_ = sStack_1a4;
            auVar58._30_2_ = sStack_1a2;
            local_1e0 = auVar56;
          }
          else {
            piVar3 = matrix->matrix;
            uVar36 = uVar36 - 1;
            uVar38 = (ulong)uVar36;
            uVar37 = 1;
            if (1 < (int)uVar51) {
              uVar37 = (ulong)uVar51;
            }
            auVar61 = ZEXT3264(local_160);
            auVar59 = ZEXT3264(local_200);
            local_220._8_8_ = 0x80009000a000b;
            local_220._0_8_ = 0xc000d000e000f;
            local_220._16_8_ = 0x4000500060007;
            local_220._24_8_ = 0x100020003;
            local_e0 = 1;
            uStack_de = 1;
            uStack_dc = 1;
            uStack_da = 1;
            uStack_d8 = 1;
            uStack_d6 = 1;
            uStack_d4 = 1;
            uStack_d2 = 1;
            uStack_d0 = 1;
            uStack_ce = 1;
            uStack_cc = 1;
            uStack_ca = 1;
            uStack_c8 = 1;
            uStack_c6 = 1;
            uStack_c4 = 1;
            uStack_c2 = 1;
            local_140 = 0x10;
            uStack_13e = 0x10;
            uStack_13c = 0x10;
            uStack_13a = 0x10;
            uStack_138 = 0x10;
            uStack_136 = 0x10;
            uStack_134 = 0x10;
            uStack_132 = 0x10;
            uStack_130 = 0x10;
            uStack_12e = 0x10;
            uStack_12c = 0x10;
            uStack_12a = 0x10;
            uStack_128 = 0x10;
            uStack_126 = 0x10;
            uStack_124 = 0x10;
            uStack_122 = 0x10;
            local_1a0._2_2_ = sStack_1be;
            local_1a0._0_2_ = local_1c0;
            local_1a0._4_2_ = sStack_1bc;
            local_1a0._6_2_ = sStack_1ba;
            local_1a0._10_2_ = sStack_1b6;
            local_1a0._8_2_ = sStack_1b8;
            local_1a0._12_2_ = sStack_1b4;
            local_1a0._14_2_ = sStack_1b2;
            local_1a0._18_2_ = sStack_1ae;
            local_1a0._16_2_ = sStack_1b0;
            local_1a0._20_2_ = sStack_1ac;
            local_1a0._22_2_ = sStack_1aa;
            local_1a0._26_2_ = sStack_1a6;
            local_1a0._24_2_ = sStack_1a8;
            local_1a0._28_2_ = sStack_1a4;
            local_1a0._30_2_ = sStack_1a2;
            local_180._2_2_ = iVar55;
            local_180._0_2_ = iVar55;
            local_180._4_2_ = iVar55;
            local_180._6_2_ = iVar55;
            local_180._8_2_ = iVar55;
            local_180._10_2_ = iVar55;
            local_180._12_2_ = iVar55;
            local_180._14_2_ = iVar55;
            local_180._16_2_ = iVar55;
            local_180._18_2_ = iVar55;
            local_180._20_2_ = iVar55;
            local_180._22_2_ = iVar55;
            local_180._24_2_ = iVar55;
            local_180._26_2_ = iVar55;
            local_180._28_2_ = iVar55;
            local_180._30_2_ = iVar55;
            auVar62 = ZEXT3264(local_180);
            uVar54 = 0;
            do {
              if (matrix->type == 0) {
                uVar51 = (uint)ptr_02[uVar54];
                local_3c0 = (uint)ptr_02[uVar54 + 1];
                local_3c8 = (uint)ptr_02[uVar54 + 2];
                uVar35 = (uint)ptr_02[uVar54 + 3];
                local_3d0 = (uint)ptr_02[uVar54 + 4];
                uVar39 = (uint)ptr_02[uVar54 + 5];
                local_3d8 = (uint)ptr_02[uVar54 + 6];
                uVar49 = (uint)ptr_02[uVar54 + 7];
                local_3b0 = (uint)ptr_02[uVar54 + 8];
                uVar18 = (uint)ptr_02[uVar54 + 9];
                local_390 = (uint)ptr_02[uVar54 + 10];
                uVar43 = (uint)ptr_02[uVar54 + 0xb];
                local_398 = (uint)ptr_02[uVar54 + 0xc];
                uVar45 = (uint)ptr_02[uVar54 + 0xd];
                local_3a0 = (uint)ptr_02[uVar54 + 0xe];
                local_3a8 = (int)ptr_02[uVar54 + 0xf];
              }
              else {
                uVar51 = (uint)uVar54;
                local_3c0 = uVar51 | 1;
                if (uVar53 <= (uVar54 | 1)) {
                  local_3c0 = uVar36;
                }
                local_3c8 = uVar51 | 2;
                if (uVar53 <= (uVar54 | 2)) {
                  local_3c8 = uVar36;
                }
                uVar35 = uVar51 | 3;
                if (uVar53 <= (uVar54 | 3)) {
                  uVar35 = uVar36;
                }
                local_3d0 = uVar51 | 4;
                if (uVar53 <= (uVar54 | 4)) {
                  local_3d0 = uVar36;
                }
                uVar39 = uVar51 | 5;
                if (uVar53 <= (uVar54 | 5)) {
                  uVar39 = uVar36;
                }
                local_3d8 = uVar51 | 6;
                if (uVar53 <= (uVar54 | 6)) {
                  local_3d8 = uVar36;
                }
                uVar49 = uVar51 | 7;
                if (uVar53 <= (uVar54 | 7)) {
                  uVar49 = uVar36;
                }
                local_3b0 = uVar51 | 8;
                if (uVar53 <= (uVar54 | 8)) {
                  local_3b0 = uVar36;
                }
                uVar18 = uVar51 | 9;
                if (uVar53 <= (uVar54 | 9)) {
                  uVar18 = uVar36;
                }
                local_390 = uVar51 | 10;
                if (uVar53 <= (uVar54 | 10)) {
                  local_390 = uVar36;
                }
                uVar43 = uVar51 | 0xb;
                if (uVar53 <= (uVar54 | 0xb)) {
                  uVar43 = uVar36;
                }
                local_398 = uVar51 | 0xc;
                if (uVar53 <= (uVar54 | 0xc)) {
                  local_398 = uVar36;
                }
                uVar45 = uVar51 | 0xd;
                if (uVar53 <= (uVar54 | 0xd)) {
                  uVar45 = uVar36;
                }
                local_3a0 = uVar51 | 0xe;
                if (uVar53 <= (uVar54 | 0xe)) {
                  local_3a0 = uVar36;
                }
                local_3a8 = uVar51 | 0xf;
                if (uVar53 <= (uVar54 | 0xf)) {
                  local_3a8 = uVar36;
                }
              }
              iVar20 = matrix->size;
              uVar23 = uVar54 | 1;
              uVar24 = uVar54 | 2;
              uVar25 = uVar54 | 3;
              uVar26 = uVar54 | 4;
              uVar27 = uVar54 | 5;
              uVar28 = uVar54 | 6;
              uVar29 = uVar54 | 7;
              uVar30 = uVar54 | 8;
              uVar31 = uVar54 | 9;
              uVar32 = uVar54 | 10;
              uVar33 = uVar54 | 0xb;
              uVar44 = uVar54 | 0xc;
              uVar46 = uVar54 | 0xd;
              uVar47 = uVar54 | 0xe;
              uVar48 = uVar54 | 0xf;
              auVar9._2_2_ = uStack_11e;
              auVar9._0_2_ = local_120;
              auVar9._4_2_ = uStack_11c;
              auVar9._6_2_ = uStack_11a;
              auVar9._8_2_ = uStack_118;
              auVar9._10_2_ = uStack_116;
              auVar9._12_2_ = uStack_114;
              auVar9._14_2_ = uStack_112;
              auVar9._16_2_ = uStack_110;
              auVar9._18_2_ = uStack_10e;
              auVar9._20_2_ = uStack_10c;
              auVar9._22_2_ = uStack_10a;
              auVar9._24_2_ = uStack_108;
              auVar9._26_2_ = uStack_106;
              auVar9._28_2_ = uStack_104;
              auVar9._30_2_ = uStack_102;
              auVar9 = vpcmpgtw_avx2(auVar9,local_220);
              auVar12 = vpmovsxbw_avx2(_DAT_0090923c);
              auVar13._2_2_ = iVar55;
              auVar13._0_2_ = iVar55;
              auVar13._4_2_ = iVar55;
              auVar13._6_2_ = iVar55;
              auVar13._8_2_ = iVar55;
              auVar13._10_2_ = iVar55;
              auVar13._12_2_ = iVar55;
              auVar13._14_2_ = iVar55;
              auVar13._16_2_ = iVar55;
              auVar13._18_2_ = iVar55;
              auVar13._20_2_ = iVar55;
              auVar13._22_2_ = iVar55;
              auVar13._24_2_ = iVar55;
              auVar13._26_2_ = iVar55;
              auVar13._28_2_ = iVar55;
              auVar13._30_2_ = iVar55;
              uVar34 = 0;
              auVar58 = auVar13;
              auVar56 = local_100;
              auVar8 = local_100;
              do {
                auVar65 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar49 * iVar20) +
                                                           (long)*(short *)(ptr[1] + uVar34 * 2)]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(local_3d8 * iVar20) +
                                                       (long)*(short *)(ptr[1] + uVar34 * 2 + 2)),1)
                ;
                auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar39 * iVar20) +
                                                               (long)*(short *)(ptr[1] + uVar34 * 2
                                                                                         + 4)),2);
                auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(local_3d0 * iVar20) +
                                                               (long)*(short *)(ptr[1] + uVar34 * 2
                                                                                         + 6)),3);
                auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar35 * iVar20) +
                                                               (long)*(short *)(ptr[1] + uVar34 * 2
                                                                                         + 8)),4);
                auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(local_3c8 * iVar20) +
                                                               (long)*(short *)(ptr[1] + uVar34 * 2
                                                                                         + 10)),5);
                auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(local_3c0 * iVar20) +
                                                               (long)*(short *)(ptr[1] + uVar34 * 2
                                                                                         + 0xc)),6);
                auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar51 * iVar20) +
                                                               (long)*(short *)(ptr[1] + uVar34 * 2
                                                                                         + 0xe)),7);
                auVar66 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(local_3a8 * iVar20) +
                                                           (long)*(short *)(*ptr + uVar34 * 2)]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(local_3a0 * iVar20) +
                                                       (long)*(short *)(*ptr + uVar34 * 2 + 2)),1);
                auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar45 * iVar20) +
                                                               (long)*(short *)(*ptr + uVar34 * 2 +
                                                                                       4)),2);
                auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(local_398 * iVar20) +
                                                               (long)*(short *)(*ptr + uVar34 * 2 +
                                                                                       6)),3);
                auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar43 * iVar20) +
                                                               (long)*(short *)(*ptr + uVar34 * 2 +
                                                                                       8)),4);
                auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(local_390 * iVar20) +
                                                               (long)*(short *)(*ptr + uVar34 * 2 +
                                                                                       10)),5);
                auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar18 * iVar20) +
                                                               (long)*(short *)(*ptr + uVar34 * 2 +
                                                                                       0xc)),6);
                auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(local_3b0 * iVar20) +
                                                               (long)*(short *)(*ptr + uVar34 * 2 +
                                                                                       0xe)),7);
                auVar63._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar66;
                auVar63._16_16_ = ZEXT116(1) * auVar65;
                auVar63 = vpaddsw_avx2(auVar8,auVar63);
                iVar1 = ptr_00[uVar34 + 0xf];
                auVar67._2_2_ = iVar1;
                auVar67._0_2_ = iVar1;
                auVar67._4_2_ = iVar1;
                auVar67._6_2_ = iVar1;
                auVar67._8_2_ = iVar1;
                auVar67._10_2_ = iVar1;
                auVar67._12_2_ = iVar1;
                auVar67._14_2_ = iVar1;
                auVar67._16_2_ = iVar1;
                auVar67._18_2_ = iVar1;
                auVar67._20_2_ = iVar1;
                auVar67._22_2_ = iVar1;
                auVar67._24_2_ = iVar1;
                auVar67._26_2_ = iVar1;
                auVar67._28_2_ = iVar1;
                auVar67._30_2_ = iVar1;
                auVar8 = vpalignr_avx2(ZEXT1632(auVar56._16_16_),auVar56,2);
                auVar64 = vpblendw_avx2(auVar8,auVar67,0x80);
                auVar8 = vpblendd_avx2(auVar8,auVar64,0xf0);
                auVar58 = vpalignr_avx2(ZEXT1632(auVar58._16_16_),auVar58,2);
                iVar1 = ptr_01[uVar34 + 0xf];
                auVar64._2_2_ = iVar1;
                auVar64._0_2_ = iVar1;
                auVar64._4_2_ = iVar1;
                auVar64._6_2_ = iVar1;
                auVar64._8_2_ = iVar1;
                auVar64._10_2_ = iVar1;
                auVar64._12_2_ = iVar1;
                auVar64._14_2_ = iVar1;
                auVar64._16_2_ = iVar1;
                auVar64._18_2_ = iVar1;
                auVar64._20_2_ = iVar1;
                auVar64._22_2_ = iVar1;
                auVar64._24_2_ = iVar1;
                auVar64._26_2_ = iVar1;
                auVar64._28_2_ = iVar1;
                auVar64._30_2_ = iVar1;
                auVar64 = vpblendw_avx2(auVar58,auVar64,0x80);
                auVar64 = vpblendd_avx2(auVar58,auVar64,0xf0);
                auVar57._2_2_ = uStack_7e;
                auVar57._0_2_ = local_80;
                auVar57._4_2_ = uStack_7c;
                auVar57._6_2_ = uStack_7a;
                auVar57._8_2_ = uStack_78;
                auVar57._10_2_ = uStack_76;
                auVar57._12_2_ = uStack_74;
                auVar57._14_2_ = uStack_72;
                auVar57._16_2_ = uStack_70;
                auVar57._18_2_ = uStack_6e;
                auVar57._20_2_ = uStack_6c;
                auVar57._22_2_ = uStack_6a;
                auVar57._24_2_ = uStack_68;
                auVar57._26_2_ = uStack_66;
                auVar57._28_2_ = uStack_64;
                auVar57._30_2_ = uStack_62;
                auVar58 = vpsubsw_avx2(auVar8,auVar57);
                auVar10._2_2_ = uStack_9e;
                auVar10._0_2_ = local_a0;
                auVar10._4_2_ = uStack_9c;
                auVar10._6_2_ = uStack_9a;
                auVar10._8_2_ = uStack_98;
                auVar10._10_2_ = uStack_96;
                auVar10._12_2_ = uStack_94;
                auVar10._14_2_ = uStack_92;
                auVar10._16_2_ = uStack_90;
                auVar10._18_2_ = uStack_8e;
                auVar10._20_2_ = uStack_8c;
                auVar10._22_2_ = uStack_8a;
                auVar10._24_2_ = uStack_88;
                auVar10._26_2_ = uStack_86;
                auVar10._28_2_ = uStack_84;
                auVar10._30_2_ = uStack_82;
                auVar64 = vpsubsw_avx2(auVar64,auVar10);
                auVar58 = vpmaxsw_avx2(auVar58,auVar64);
                auVar56 = vpsubsw_avx2(auVar56,auVar57);
                auVar13 = vpsubsw_avx2(auVar13,auVar10);
                auVar64 = vpmaxsw_avx2(auVar56,auVar13);
                auVar56 = vpmaxsw_avx2(auVar64,auVar58);
                auVar56 = vpmaxsw_avx2(auVar56,_DAT_00908c40);
                auVar63 = vpmaxsw_avx2(auVar63,auVar56);
                auVar13 = vpcmpeqw_avx2(auVar12,_DAT_00909280);
                auVar56 = vpandn_avx2(auVar13,auVar63);
                if (0xf < uVar34) {
                  local_1a0 = vpminsw_avx2(auVar56,local_1a0);
                  local_180 = vpmaxsw_avx2(auVar56,local_180);
                }
                piVar4 = ((ppVar21->field_4).rowcols)->score_row;
                piVar5 = ((ppVar21->field_4).rowcols)->score_col;
                auVar65 = auVar56._0_16_;
                auVar66 = auVar56._16_16_;
                if (uVar54 == uVar38 && uVar34 < uVar50) {
                  iVar52 = vpextrw_avx(auVar66,7);
                  piVar4[uVar34] = iVar52;
                }
                if (s2Len - 1 == uVar34) {
                  iVar52 = vpextrw_avx(auVar66,7);
                  piVar5[uVar54] = iVar52;
                }
                if (uVar34 - 1 < uVar50 && uVar23 == uVar38) {
                  iVar52 = vpextrw_avx(auVar66,6);
                  piVar4[uVar34 - 1] = iVar52;
                }
                if (uVar50 == uVar34 && uVar23 < uVar53) {
                  iVar52 = vpextrw_avx(auVar66,6);
                  piVar5[uVar23] = iVar52;
                }
                if ((uVar24 == uVar38) && ((long)(uVar34 - 2) < (long)uVar50 && 1 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar66,5);
                  piVar4[uVar34 - 2] = iVar52;
                }
                if (uVar50 + 1 == uVar34 && uVar24 < uVar53) {
                  iVar52 = vpextrw_avx(auVar66,5);
                  piVar5[uVar24] = iVar52;
                }
                if ((uVar25 == uVar38) && ((long)(uVar34 - 3) < (long)uVar50 && 2 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar66,4);
                  piVar4[uVar34 - 3] = iVar52;
                }
                if (uVar50 + 2 == uVar34 && uVar25 < uVar53) {
                  iVar52 = vpextrw_avx(auVar66,4);
                  piVar5[uVar25] = iVar52;
                }
                if ((uVar26 == uVar38) && ((long)(uVar34 - 4) < (long)uVar50 && 3 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar66,3);
                  piVar4[uVar34 - 4] = iVar52;
                }
                if (uVar50 + 3 == uVar34 && uVar26 < uVar53) {
                  iVar52 = vpextrw_avx(auVar66,3);
                  piVar5[uVar26] = iVar52;
                }
                if ((uVar27 == uVar38) && ((long)(uVar34 - 5) < (long)uVar50 && 4 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar66,2);
                  piVar4[uVar34 - 5] = iVar52;
                }
                if (uVar50 + 4 == uVar34 && uVar27 < uVar53) {
                  iVar52 = vpextrw_avx(auVar66,2);
                  piVar5[uVar27] = iVar52;
                }
                if ((uVar28 == uVar38) && ((long)(uVar34 - 6) < (long)uVar50 && 5 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar66,1);
                  piVar4[uVar34 - 6] = iVar52;
                }
                if (uVar50 + 5 == uVar34 && uVar28 < uVar53) {
                  iVar52 = vpextrw_avx(auVar66,1);
                  piVar5[uVar28] = iVar52;
                }
                if ((uVar29 == uVar38) && ((long)(uVar34 - 7) < (long)uVar50 && 6 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar66,0);
                  piVar4[uVar34 - 7] = iVar52;
                }
                if (uVar50 + 6 == uVar34 && uVar29 < uVar53) {
                  iVar52 = vpextrw_avx(auVar66,0);
                  piVar5[uVar29] = iVar52;
                }
                if ((uVar30 == uVar38) && ((long)(uVar34 - 8) < (long)uVar50 && 7 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar65,7);
                  piVar4[uVar34 - 8] = iVar52;
                }
                if (uVar50 + 7 == uVar34 && uVar30 < uVar53) {
                  iVar52 = vpextrw_avx(auVar65,7);
                  piVar5[uVar30] = iVar52;
                }
                if ((uVar31 == uVar38) && ((long)(uVar34 - 9) < (long)uVar50 && 8 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar65,6);
                  piVar4[uVar34 - 9] = iVar52;
                }
                if (uVar50 + 8 == uVar34 && uVar31 < uVar53) {
                  iVar52 = vpextrw_avx(auVar65,6);
                  piVar5[uVar31] = iVar52;
                }
                if ((uVar32 == uVar38) && ((long)(uVar34 - 10) < (long)uVar50 && 9 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar65,5);
                  piVar4[uVar34 - 10] = iVar52;
                }
                if (uVar50 + 9 == uVar34 && uVar32 < uVar53) {
                  iVar52 = vpextrw_avx(auVar65,5);
                  piVar5[uVar32] = iVar52;
                }
                if ((uVar33 == uVar38) && ((long)(uVar34 - 0xb) < (long)uVar50 && 10 < uVar34)) {
                  iVar52 = vpextrw_avx(auVar65,4);
                  piVar4[uVar34 - 0xb] = iVar52;
                }
                if (uVar50 + 10 == uVar34 && uVar33 < uVar53) {
                  iVar52 = vpextrw_avx(auVar65,4);
                  piVar5[uVar33] = iVar52;
                }
                if ((uVar44 == uVar38) && ((long)(uVar34 - 0xc) < (long)uVar50 && 0xb < uVar34)) {
                  iVar52 = vpextrw_avx(auVar65,3);
                  piVar4[uVar34 - 0xc] = iVar52;
                }
                if (uVar50 + 0xb == uVar34 && uVar44 < uVar53) {
                  iVar52 = vpextrw_avx(auVar65,3);
                  piVar5[uVar44] = iVar52;
                }
                if ((uVar46 == uVar38) && ((long)(uVar34 - 0xd) < (long)uVar50 && 0xc < uVar34)) {
                  iVar52 = vpextrw_avx(auVar65,2);
                  piVar4[uVar34 - 0xd] = iVar52;
                }
                if (uVar50 + 0xc == uVar34 && uVar46 < uVar53) {
                  iVar52 = vpextrw_avx(auVar65,2);
                  piVar5[uVar46] = iVar52;
                }
                if ((uVar47 == uVar38) && ((long)(uVar34 - 0xe) < (long)uVar50 && 0xd < uVar34)) {
                  iVar52 = vpextrw_avx(auVar65,1);
                  piVar4[uVar34 - 0xe] = iVar52;
                }
                if (uVar50 + 0xd == uVar34 && uVar47 < uVar53) {
                  iVar52 = vpextrw_avx(auVar65,1);
                  piVar5[uVar47] = iVar52;
                }
                if (0xe < uVar34 && uVar48 == uVar38) {
                  iVar52 = vpextrw_avx(auVar65,0);
                  piVar4[uVar34 - 0xf] = iVar52;
                }
                auVar11._2_2_ = iVar55;
                auVar11._0_2_ = iVar55;
                auVar11._4_2_ = iVar55;
                auVar11._6_2_ = iVar55;
                auVar11._8_2_ = iVar55;
                auVar11._10_2_ = iVar55;
                auVar11._12_2_ = iVar55;
                auVar11._14_2_ = iVar55;
                auVar11._16_2_ = iVar55;
                auVar11._18_2_ = iVar55;
                auVar11._20_2_ = iVar55;
                auVar11._22_2_ = iVar55;
                auVar11._24_2_ = iVar55;
                auVar11._26_2_ = iVar55;
                auVar11._28_2_ = iVar55;
                auVar11._30_2_ = iVar55;
                auVar58 = vpblendvb_avx2(auVar58,auVar11,auVar13);
                if (uVar50 + 0xe == uVar34 && uVar48 < uVar53) {
                  piVar5[uVar48] = auVar56._0_4_ & 0xffff;
                }
                auVar17._2_2_ = uStack_be;
                auVar17._0_2_ = local_c0;
                auVar17._4_2_ = uStack_bc;
                auVar17._6_2_ = uStack_ba;
                auVar17._8_2_ = uStack_b8;
                auVar17._10_2_ = uStack_b6;
                auVar17._12_2_ = uStack_b4;
                auVar17._14_2_ = uStack_b2;
                auVar17._16_2_ = uStack_b0;
                auVar17._18_2_ = uStack_ae;
                auVar17._20_2_ = uStack_ac;
                auVar17._22_2_ = uStack_aa;
                auVar17._24_2_ = uStack_a8;
                auVar17._26_2_ = uStack_a6;
                auVar17._28_2_ = uStack_a4;
                auVar17._30_2_ = uStack_a2;
                auVar10 = vpcmpgtw_avx2(auVar17,auVar12);
                auVar10 = vpand_avx2(auVar10,auVar9);
                auVar57 = vpsraw_avx2(auVar12,0xf);
                auVar57 = vpandn_avx2(auVar57,auVar10);
                auVar65 = vpacksswb_avx(auVar57._0_16_,auVar57._16_16_);
                auVar60 = auVar61._0_32_;
                auVar67 = vpcmpeqw_avx2(auVar56,auVar60);
                auVar11 = vpcmpgtw_avx2(auVar56,auVar60);
                auVar10 = vpand_avx2(auVar11,auVar57);
                local_160 = vpblendvb_avx2(auVar60,auVar63,auVar10);
                auVar61 = ZEXT3264(local_160);
                auVar66 = vpacksswb_avx(auVar10._0_16_,auVar10._16_16_);
                auVar63 = vpcmpgtw_avx2(auVar59._0_32_,auVar12);
                auVar63 = vpand_avx2(auVar63,auVar67);
                auVar7 = vpacksswb_avx(auVar63._0_16_,auVar63._16_16_);
                auVar65 = vpblendvb_avx(auVar66,auVar65,auVar7);
                auVar60._2_2_ = iVar55;
                auVar60._0_2_ = iVar55;
                auVar60._4_2_ = iVar55;
                auVar60._6_2_ = iVar55;
                auVar60._8_2_ = iVar55;
                auVar60._10_2_ = iVar55;
                auVar60._12_2_ = iVar55;
                auVar60._14_2_ = iVar55;
                auVar60._16_2_ = iVar55;
                auVar60._18_2_ = iVar55;
                auVar60._20_2_ = iVar55;
                auVar60._22_2_ = iVar55;
                auVar60._24_2_ = iVar55;
                auVar60._26_2_ = iVar55;
                auVar60._28_2_ = iVar55;
                auVar60._30_2_ = iVar55;
                auVar13 = vpblendvb_avx2(auVar64,auVar60,auVar13);
                auVar64 = vpmovsxbw_avx2(auVar65);
                local_1e0 = vpblendvb_avx2(auVar62._0_32_,local_220,auVar64);
                auVar62 = ZEXT3264(local_1e0);
                auVar63 = vpor_avx2(auVar63,auVar11);
                auVar63 = vpand_avx2(auVar57,auVar63);
                local_200 = vpblendvb_avx2(auVar59._0_32_,auVar12,auVar63);
                auVar59 = ZEXT3264(local_200);
                ptr_00[uVar34] = auVar56._0_2_;
                vpextrw_avx(auVar58._0_16_,0);
                auVar16._8_2_ = 1;
                auVar16._0_8_ = 0x1000100010001;
                auVar16._10_2_ = 1;
                auVar16._12_2_ = 1;
                auVar16._14_2_ = 1;
                auVar16._16_2_ = 1;
                auVar16._18_2_ = 1;
                auVar16._20_2_ = 1;
                auVar16._22_2_ = 1;
                auVar16._24_2_ = 1;
                auVar16._26_2_ = 1;
                auVar16._28_2_ = 1;
                auVar16._30_2_ = 1;
                auVar12 = vpaddsw_avx2(auVar12,auVar16);
                uVar34 = uVar34 + 1;
              } while (uVar37 != uVar34);
              auVar8._8_2_ = 0x10;
              auVar8._0_8_ = 0x10001000100010;
              auVar8._10_2_ = 0x10;
              auVar8._12_2_ = 0x10;
              auVar8._14_2_ = 0x10;
              auVar8._16_2_ = 0x10;
              auVar8._18_2_ = 0x10;
              auVar8._20_2_ = 0x10;
              auVar8._22_2_ = 0x10;
              auVar8._24_2_ = 0x10;
              auVar8._26_2_ = 0x10;
              auVar8._28_2_ = 0x10;
              auVar8._30_2_ = 0x10;
              local_220 = vpaddsw_avx2(local_220,auVar8);
              uVar54 = uVar54 + 0x10;
            } while (uVar54 < uVar53);
            auVar56 = local_180;
            auVar58 = local_1a0;
          }
          lVar22 = 0;
          iVar19 = 0;
          iVar20 = 0;
          iVar52 = 0;
          do {
            uVar2 = *(ushort *)(local_160 + lVar22 * 2);
            if ((short)(ushort)uVar41 < (short)uVar2) {
              uVar41 = (uint)uVar2;
              iVar20 = (int)*(short *)(local_1e0 + lVar22 * 2);
              iVar52 = (int)*(short *)(local_200 + lVar22 * 2);
              iVar19 = (int)*(short *)(local_1e0 + lVar22 * 2);
            }
            else if (uVar2 == (ushort)uVar41) {
              iVar42 = (int)*(short *)(local_200 + lVar22 * 2);
              if (iVar42 < iVar52) {
                iVar20 = (int)*(short *)(local_1e0 + lVar22 * 2);
                iVar52 = iVar42;
                iVar19 = (int)*(short *)(local_1e0 + lVar22 * 2);
              }
              else if ((iVar52 == iVar42) &&
                      (iVar42 = (int)*(short *)(local_1e0 + lVar22 * 2), bVar6 = iVar42 <= iVar20,
                      iVar20 = iVar19, bVar6)) {
                iVar20 = iVar42;
                iVar19 = iVar42;
              }
            }
            sVar40 = (short)uVar41;
            lVar22 = lVar22 + 1;
          } while ((int)lVar22 != 0x10);
          auVar14._2_2_ = iVar55;
          auVar14._0_2_ = iVar55;
          auVar14._4_2_ = iVar55;
          auVar14._6_2_ = iVar55;
          auVar14._8_2_ = iVar55;
          auVar14._10_2_ = iVar55;
          auVar14._12_2_ = iVar55;
          auVar14._14_2_ = iVar55;
          auVar14._16_2_ = iVar55;
          auVar14._18_2_ = iVar55;
          auVar14._20_2_ = iVar55;
          auVar14._22_2_ = iVar55;
          auVar14._24_2_ = iVar55;
          auVar14._26_2_ = iVar55;
          auVar14._28_2_ = iVar55;
          auVar14._30_2_ = iVar55;
          auVar12 = vpcmpgtw_avx2(auVar14,auVar58);
          auVar15._2_2_ = sStack_1be;
          auVar15._0_2_ = local_1c0;
          auVar15._4_2_ = sStack_1bc;
          auVar15._6_2_ = sStack_1ba;
          auVar15._8_2_ = sStack_1b8;
          auVar15._10_2_ = sStack_1b6;
          auVar15._12_2_ = sStack_1b4;
          auVar15._14_2_ = sStack_1b2;
          auVar15._16_2_ = sStack_1b0;
          auVar15._18_2_ = sStack_1ae;
          auVar15._20_2_ = sStack_1ac;
          auVar15._22_2_ = sStack_1aa;
          auVar15._24_2_ = sStack_1a8;
          auVar15._26_2_ = sStack_1a6;
          auVar15._28_2_ = sStack_1a4;
          auVar15._30_2_ = sStack_1a2;
          auVar56 = vpcmpgtw_avx2(auVar56,auVar15);
          auVar12 = vpor_avx2(auVar12,auVar56);
          if ((((((((((((((((((((((((((((((((auVar12 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar12 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar12 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar12 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar12 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar12 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar12 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar12 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar12 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar12 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar12 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar12 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar12 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar12 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar12 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar12 >> 0x7f,0) != '\0') ||
                            (auVar12 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar12 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar12 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar12 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar12 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar12 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar12 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar12 >> 0xbf,0) != '\0') ||
                    (auVar12 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar12 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar12 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar12 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar12 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
            sVar40 = 0;
            iVar52 = 0;
            iVar20 = 0;
          }
          ppVar21->score = (int)sVar40;
          ppVar21->end_query = iVar20;
          ppVar21->end_ref = iVar52;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar21;
          }
          return ppVar21;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}